

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_set.c
# Opt level: O1

set_value set_remove(set s,set_key key)

{
  int iVar1;
  hash hVar2;
  size_t line;
  char *message;
  set_value value;
  void *local_18;
  
  local_18 = (set_value)0x0;
  if (s == (set)0x0 || key == (set_key)0x0) {
    message = "Invalid set remove parameters";
    line = 0x16d;
  }
  else {
    hVar2 = (*s->hash_cb)(key);
    iVar1 = bucket_remove(s->buckets + hVar2 % s->capacity,s->compare_cb,key,&local_18);
    if (iVar1 == 0) {
      s->count = s->count - 1;
      iVar1 = set_bucket_realloc(s);
      if (iVar1 == 0) {
        return local_18;
      }
      message = "Invalid set bucket remove reallocation";
      line = 0x181;
    }
    else {
      message = "Invalid set bucket remove: %p";
      line = 0x179;
    }
  }
  log_write_impl_va("metacall",line,"set_remove",
                    "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/adt/source/adt_set.c"
                    ,LOG_LEVEL_ERROR,message);
  return (set_value)0x0;
}

Assistant:

set_value set_remove(set s, set_key key)
{
	set_hash h;
	size_t index;
	bucket b;
	set_value value = NULL;

	if (s == NULL || key == NULL)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Invalid set remove parameters");
		return NULL;
	}

	h = s->hash_cb(key);

	index = h % s->capacity;

	b = &s->buckets[index];

	if (bucket_remove(b, s->compare_cb, key, &value) != 0)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Invalid set bucket remove: %p", key);
		return NULL;
	}

	--s->count;

	if (set_bucket_realloc(s) != 0)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Invalid set bucket remove reallocation");
		return NULL;
	}

	return value;
}